

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

void __thiscall
cfd::core::Privkey::Privkey(Privkey *this,string *hex_str,NetType net_type,bool is_compressed)

{
  bool bVar1;
  CfdException *this_00;
  string sStack_58;
  CfdSourceLocation local_38;
  
  ByteData::ByteData(&this->data_,hex_str);
  this->is_compressed_ = is_compressed;
  this->net_type_ = net_type;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sStack_58,
                     &this->data_);
  bVar1 = IsValid((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sStack_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sStack_58);
  if (bVar1) {
    return;
  }
  local_38.filename = "cfdcore_key.cpp";
  local_38.line = 0xfb;
  local_38.funcname = "Privkey";
  ByteData::GetHex_abi_cxx11_(&sStack_58,&this->data_);
  logger::warn<std::__cxx11::string>(&local_38,"Invalid Privkey data. hex={}.",&sStack_58);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&sStack_58,"Invalid Privkey data.",(allocator *)&local_38);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&sStack_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Privkey::Privkey(
    const std::string &hex_str, NetType net_type, bool is_compressed)
    : data_(ByteData(hex_str)),
      is_compressed_(is_compressed),
      net_type_(net_type) {
  if (!IsValid(data_.GetBytes())) {
    warn(CFD_LOG_SOURCE, "Invalid Privkey data. hex={}.", data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Privkey data.");
  }
}